

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void VmJsonDequoteString(SyString *pStr,jx9_value *pWorker)

{
  SyString *pSVar1;
  char cVar2;
  byte bVar3;
  undefined8 in_RAX;
  jx9_value *in_RDX;
  char *zString;
  SyString *pSVar4;
  SyString *pSVar5;
  int c;
  undefined8 uStack_38;
  
  pSVar5 = (SyString *)((long)&pStr->zString + ((ulong)pWorker & 0xffffffff));
  uStack_38 = in_RAX;
  jx9_value_string(in_RDX,"",0);
  do {
    pSVar4 = pStr;
    if (pStr < pSVar5) {
      do {
        if (*(char *)&pSVar4->zString == '\\') break;
        pSVar4 = (SyString *)((long)&pSVar4->zString + 1);
      } while (pSVar4 < pSVar5);
      if (pStr < pSVar4) {
        jx9_value_string(in_RDX,(char *)pStr,(int)pSVar4 - (int)pStr);
      }
    }
    pSVar1 = (SyString *)((long)&pSVar4->zString + 1);
    if (pSVar5 <= pSVar1) {
      return;
    }
    cVar2 = *(char *)&pSVar1->zString;
    uStack_38 = CONCAT44((int)cVar2,(undefined4)uStack_38);
    bVar3 = (byte)(cVar2 + 0x9aU) >> 1 | cVar2 * -0x80;
    zString = (char *)((long)&uStack_38 + 4);
    if ((bVar3 < 8) && ((0xd1U >> (bVar3 & 0x1f) & 1) != 0)) {
      zString = &DAT_00143488 + *(int *)(&DAT_00143488 + (ulong)bVar3 * 4);
    }
    jx9_value_string(in_RDX,zString,1);
    pStr = (SyString *)((long)&pSVar4->zString + 2);
  } while( true );
}

Assistant:

static void VmJsonDequoteString(const SyString *pStr, jx9_value *pWorker)
{
	const char *zIn = pStr->zString;
	const char *zEnd = &pStr->zString[pStr->nByte];
	const char *zCur;
	int c;
	/* Mark the value as a string */
	jx9_value_string(pWorker, "", 0); /* Empty string */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append chunk verbatim */
			jx9_value_string(pWorker, zCur, (int)(zIn-zCur));
		}
		zIn++;
		if( zIn >= zEnd ){
			/* End of the input reached */
			break;
		}
		c = zIn[0];
		/* Unescape the character */
		switch(c){
		case '"':  jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case '\\': jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case 'n':  jx9_value_string(pWorker, "\n", (int)sizeof(char)); break;
		case 'r':  jx9_value_string(pWorker, "\r", (int)sizeof(char)); break;
		case 't':  jx9_value_string(pWorker, "\t", (int)sizeof(char)); break;
		case 'f':  jx9_value_string(pWorker, "\f", (int)sizeof(char)); break;
		default:
			jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char));
			break;
		}
		/* Advance the stream cursor */
		zIn++;
	}
}